

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O0

ngx_int_t ngx_radix128tree_insert(ngx_radix_tree_t *tree,u_char *key,u_char *mask,uintptr_t value)

{
  ngx_radix_node_t *pnVar1;
  ngx_radix_node_t *local_50;
  ngx_radix_node_t *next;
  ngx_radix_node_t *node;
  ngx_uint_t i;
  u_char bit;
  uintptr_t value_local;
  u_char *mask_local;
  u_char *key_local;
  ngx_radix_tree_t *tree_local;
  
  node = (ngx_radix_node_t *)0x0;
  i._7_1_ = 0x80;
  next = tree->root;
  local_50 = tree->root;
  while ((i._7_1_ & mask[(long)node]) != 0) {
    if ((key[(long)node] & i._7_1_) == 0) {
      local_50 = next->left;
    }
    else {
      local_50 = next->right;
    }
    if (local_50 == (ngx_radix_node_t *)0x0) break;
    i._7_1_ = (byte)((int)(uint)i._7_1_ >> 1);
    next = local_50;
    if (i._7_1_ == 0) {
      node = (ngx_radix_node_t *)((long)&node->right + 1);
      if (node == (ngx_radix_node_t *)0x10) break;
      i._7_1_ = 0x80;
    }
  }
  if (local_50 == (ngx_radix_node_t *)0x0) {
    while ((i._7_1_ & mask[(long)node]) != 0) {
      pnVar1 = ngx_radix_alloc(tree);
      if (pnVar1 == (ngx_radix_node_t *)0x0) {
        return -1;
      }
      pnVar1->right = (ngx_radix_node_t *)0x0;
      pnVar1->left = (ngx_radix_node_t *)0x0;
      pnVar1->parent = next;
      pnVar1->value = 0xffffffffffffffff;
      if ((key[(long)node] & i._7_1_) == 0) {
        next->left = pnVar1;
      }
      else {
        next->right = pnVar1;
      }
      i._7_1_ = (byte)((int)(uint)i._7_1_ >> 1);
      next = pnVar1;
      if (i._7_1_ == 0) {
        node = (ngx_radix_node_t *)((long)&node->right + 1);
        if (node == (ngx_radix_node_t *)0x10) break;
        i._7_1_ = 0x80;
      }
    }
    next->value = value;
    tree_local = (ngx_radix_tree_t *)0x0;
  }
  else if (next->value == 0xffffffffffffffff) {
    next->value = value;
    tree_local = (ngx_radix_tree_t *)0x0;
  }
  else {
    tree_local = (ngx_radix_tree_t *)0xfffffffffffffffd;
  }
  return (ngx_int_t)tree_local;
}

Assistant:

ngx_int_t
ngx_radix128tree_insert(ngx_radix_tree_t *tree, u_char *key, u_char *mask,
    uintptr_t value)
{
    u_char             bit;
    ngx_uint_t         i;
    ngx_radix_node_t  *node, *next;

    i = 0;
    bit = 0x80;

    node = tree->root;
    next = tree->root;

    while (bit & mask[i]) {
        if (key[i] & bit) {
            next = node->right;

        } else {
            next = node->left;
        }

        if (next == NULL) {
            break;
        }

        bit >>= 1;
        node = next;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    if (next) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            return NGX_BUSY;
        }

        node->value = value;
        return NGX_OK;
    }

    while (bit & mask[i]) {
        next = ngx_radix_alloc(tree);
        if (next == NULL) {
            return NGX_ERROR;
        }

        next->right = NULL;
        next->left = NULL;
        next->parent = node;
        next->value = NGX_RADIX_NO_VALUE;

        if (key[i] & bit) {
            node->right = next;

        } else {
            node->left = next;
        }

        bit >>= 1;
        node = next;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    node->value = value;

    return NGX_OK;
}